

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

bool __thiscall DSaveMenu::Responder(DSaveMenu *this,event_t *ev)

{
  short sVar1;
  bool bVar2;
  event_t *ev_local;
  DSaveMenu *this_local;
  
  if ((ev->subtype == '\x01') && ((this->super_DLoadSaveMenu).Selected != -1)) {
    sVar1 = ev->data1;
    if ((sVar1 == 8) || (sVar1 == 0x1a)) {
      if ((this->super_DLoadSaveMenu).Selected == 0) {
        return true;
      }
    }
    else if (sVar1 == 0x4e) {
      (this->super_DLoadSaveMenu).TopItem = 0;
      (this->super_DLoadSaveMenu).Selected = 0;
      DLoadSaveMenu::UnloadSaveData(&this->super_DLoadSaveMenu);
      return true;
    }
  }
  bVar2 = DLoadSaveMenu::Responder(&this->super_DLoadSaveMenu,ev);
  return bVar2;
}

Assistant:

bool DSaveMenu::Responder (event_t *ev)
{
	if (ev->subtype == EV_GUI_KeyDown)
	{
		if (Selected != -1)
		{
			switch (ev->data1)
			{
			case GK_DEL:
			case '\b':
				// cannot delete 'new save game' item
				if (Selected == 0) return true;
				break;

			case 'N':
				Selected = TopItem = 0;
				UnloadSaveData ();
				return true;
			}
		}
	}
	return Super::Responder(ev);
}